

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void mouse_callback(GLFWwindow *window,double xpos,double ypos)

{
  double dVar1;
  double dVar2;
  double dVar3;
  float fVar4;
  float fVar5;
  vec<3,_float,_(glm::qualifier)0> vVar6;
  vec3 front;
  vec<3,_float,_(glm::qualifier)0> local_18;
  
  if (firstMouse) {
    lastX = (float)xpos;
    lastY = (float)ypos;
    firstMouse = false;
  }
  yaw = (float)(xpos - (double)lastX) * 0.5 + yaw;
  fVar4 = (float)((double)lastY - ypos) * 0.5 + pitch;
  fVar5 = 89.0;
  if (fVar4 <= 89.0) {
    fVar5 = fVar4;
  }
  pitch = -89.0;
  if (-89.0 <= fVar5) {
    pitch = fVar5;
  }
  lastX = (float)xpos;
  lastY = (float)ypos;
  dVar1 = cos((double)(yaw * 0.017453292));
  dVar2 = cos((double)(pitch * 0.017453292));
  dVar3 = sin((double)(pitch * 0.017453292));
  local_18.field_1.y = (float)dVar3;
  local_18.field_0.x = (float)(dVar2 * dVar1);
  dVar1 = sin((double)(yaw * 0.017453292));
  dVar2 = cos((double)(pitch * 0.017453292));
  local_18.field_2.z = (float)(dVar2 * dVar1);
  vVar6 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_18);
  cameraFront.field_0 = SUB84(vVar6._0_8_,0);
  cameraFront.field_1 = SUB84(vVar6._0_8_,4);
  cameraFront.field_2 = vVar6.field_2;
  return;
}

Assistant:

static void mouse_callback(GLFWwindow* window, double xpos, double ypos){
    if(firstMouse){
        lastX = xpos;
        lastY = ypos;
        firstMouse = false;
    }
    float xOffset = xpos - lastX;
    float yOffset = lastY - ypos;//注意这个
    lastX = xpos;
    lastY = ypos;
    float sensitivity = 0.5;
    xOffset *= sensitivity;
    yOffset *= sensitivity;
    yaw   += xOffset;
    pitch += yOffset;
    if(pitch > 89.0f)
        pitch = 89.0f;
    if(pitch < -89.0f)
        pitch = -89.0f;
    glm::vec3 front;
    front.x = cos(glm::radians(yaw)) * cos(glm::radians(pitch));
    front.y = sin(glm::radians(pitch));
    front.z = sin(glm::radians(yaw)) * cos(glm::radians(pitch));
    cameraFront = glm::normalize(front);
}